

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppc.c
# Opt level: O0

uint32_t cpu_ppc_load_atbu_ppc64(CPUPPCState_conflict2 *env)

{
  ppc_tb_t *tb_env_00;
  uint64_t uVar1;
  uint64_t tb;
  ppc_tb_t *tb_env;
  CPUPPCState_conflict2 *env_local;
  
  tb_env_00 = env->tb_env;
  uVar1 = qemu_clock_get_ns(QEMU_CLOCK_VIRTUAL);
  uVar1 = cpu_ppc_get_tb_ppc64(tb_env_00,uVar1,tb_env_00->atb_offset);
  return (uint32_t)(uVar1 >> 0x20);
}

Assistant:

uint32_t cpu_ppc_load_atbu (CPUPPCState *env)
{
    ppc_tb_t *tb_env = env->tb_env;
    uint64_t tb;

    tb = cpu_ppc_get_tb(tb_env, qemu_clock_get_ns(QEMU_CLOCK_VIRTUAL), tb_env->atb_offset);
    LOG_TB("%s: tb %016" PRIx64 "\n", __func__, tb);

    return tb >> 32;
}